

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O2

int h264_scaling_list(bitstream *str,uint32_t *scaling_list,int size,uint32_t *use_default_flag)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  undefined8 in_RAX;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (str->dir == VS_DECODE) {
    if (size < 1) {
      size = 0;
    }
    uVar3 = 8;
    uVar2 = 8;
    for (uVar7 = 0; (uint)size != uVar7; uVar7 = uVar7 + 1) {
      if (uVar2 == 0) {
        uVar2 = 0;
      }
      else {
        iVar1 = vs_se(str,(int32_t *)((long)&uStack_38 + 4));
        if (iVar1 != 0) {
          return 1;
        }
        uVar2 = uStack_38._4_4_ + uVar3 & 0xff;
        *use_default_flag = (uint)((int)uVar7 == 0 && uVar2 == 0);
        if (uVar2 != 0) {
          uVar3 = uVar2;
        }
      }
      scaling_list[uVar7] = uVar3;
    }
  }
  else {
    uVar3 = 0;
    if (*use_default_flag == 0) {
      uVar3 = size;
    }
    uVar2 = 1;
    if ((int)uVar3 < 1) {
      uVar2 = uVar3;
    }
    while ((uVar6 = uVar2, 1 < (int)uVar3 &&
           (uVar6 = uVar3, scaling_list[(ulong)uVar3 - 1] == scaling_list[(ulong)uVar3 - 2]))) {
      uVar3 = uVar3 - 1;
    }
    uVar5 = 0;
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar5;
    }
    uVar4 = 8;
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      uVar3 = scaling_list[uVar5] - uVar4 & 0xff;
      uStack_38 = CONCAT44(uVar3 + (uint)(uVar3 < 0x80) * 0x100 + -0x100,(undefined4)uStack_38);
      iVar1 = vs_se(str,(int32_t *)((long)&uStack_38 + 4));
      if (iVar1 != 0) {
        return 1;
      }
      uVar4 = scaling_list[uVar5];
    }
    if ((int)uVar7 != size) {
      uStack_38 = CONCAT44((-uVar4 & 0xff) + (uint)((-uVar4 & 0xff) < 0x80) * 0x100 + -0x100,
                           (undefined4)uStack_38);
      iVar1 = vs_se(str,(int32_t *)((long)&uStack_38 + 4));
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int h264_scaling_list(struct bitstream *str, uint32_t *scaling_list, int size, uint32_t *use_default_flag) {
	uint32_t lastScale = 8;
	uint32_t nextScale = 8;
	int32_t delta_scale;
	int i;
	if (str->dir == VS_DECODE) {
		for (i = 0; i < size; i++) {
			if (nextScale != 0) {
				if (vs_se(str, &delta_scale)) return 1;
				nextScale = (lastScale + delta_scale + 256)%256;
				*use_default_flag = (i == 0 && nextScale == 0);
			}
			lastScale = scaling_list[i] = (nextScale?nextScale:lastScale);
		}
	} else {
		int haltidx = size;
		if (*use_default_flag)
			haltidx = 0;
		while (haltidx >= 2 && scaling_list[haltidx-1] == scaling_list[haltidx-2])
			haltidx--;
		for (i = 0; i < haltidx; i++) {
			delta_scale = (scaling_list[i] - lastScale + 256)%256;
			if (delta_scale >= 128)
				delta_scale -= 256;
			if (vs_se(str, &delta_scale)) return 1;
			lastScale = scaling_list[i];
		}
		if (i != size) {
			delta_scale = (0 - lastScale + 256)%256;
			if (delta_scale >= 128)
				delta_scale -= 256;
			if (vs_se(str, &delta_scale)) return 1;
		}
	}
	return 0;
}